

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int MRIStepInnerStepper_AddForcing(MRIStepInnerStepper stepper,realtype t,N_Vector f)

{
  undefined8 in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  realtype *c;
  int i;
  realtype taui;
  realtype tau;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar1;
  N_Vector *X;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x16,"ARKode::MRIStep","MRIStepInnerStepper_AddForcing",
                    "Inner stepper memory is NULL");
    local_4 = -0x16;
  }
  else {
    **(undefined8 **)(in_RDI + 0x38) = 0x3ff0000000000000;
    **(undefined8 **)(in_RDI + 0x40) = in_RSI;
    c = (realtype *)((in_XMM0_Qa - *(double *)(in_RDI + 0x28)) / *(double *)(in_RDI + 0x30));
    X = (N_Vector *)&DAT_3ff0000000000000;
    for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x20); iVar1 = iVar1 + 1) {
      *(N_Vector **)(*(long *)(in_RDI + 0x38) + (long)(iVar1 + 1) * 8) = X;
      *(undefined8 *)(*(long *)(in_RDI + 0x40) + (long)(iVar1 + 1) * 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x18) + (long)iVar1 * 8);
      X = (N_Vector *)((double)c * (double)X);
    }
    N_VLinearCombination
              ((int)((ulong)in_RSI >> 0x20),c,X,(N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffc8))
    ;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MRIStepInnerStepper_AddForcing(MRIStepInnerStepper stepper,
                                   realtype t, N_Vector f)
{
  realtype tau, taui;
  int i;

  if (stepper == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepInnerStepper_AddForcing",
                    "Inner stepper memory is NULL");
    return ARK_ILL_INPUT;
  }

  /* always append the constant forcing term */
  stepper->vals[0] = ONE;
  stepper->vecs[0] = f;

  /* compute normalized time tau and initialize tau^i */
  tau  = (t - stepper->tshift) / (stepper->tscale);
  taui = ONE;

  for (i = 0; i < stepper->nforcing; i++) {
    stepper->vals[i+1] = taui;
    stepper->vecs[i+1] = stepper->forcing[i];
    taui *= tau;
  }

  N_VLinearCombination(stepper->nforcing + 1,
                       stepper->vals,
                       stepper->vecs,
                       f);

  return ARK_SUCCESS;
}